

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O1

double __thiscall
IndividualBeliefJESP::Update
          (IndividualBeliefJESP *this,IndividualBeliefJESP *b_prev,Index lastAI,Index newOI,
          JointPolicyPureVector *jpol)

{
  SDV *this_00;
  MultiAgentDecisionProcessDiscreteInterface *pMVar1;
  bool bVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  Index IVar6;
  Index jointI;
  undefined4 extraout_var;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  IndividualBeliefJESP *this_01;
  double dVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev_oHist_others;
  Scope otherAgentIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> actions;
  Index next_oHist_j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> next_oHist_others;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrO_others;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs_others;
  vector<double,_std::allocator<double>_> local_140;
  uint *local_128;
  iterator iStack_120;
  uint *local_118;
  ulong local_108;
  int local_fc;
  double local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  double local_d8;
  Index local_d0;
  undefined4 local_cc;
  Index local_c8;
  Index local_c4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  void *local_a8;
  iterator iStack_a0;
  uint *local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  IndividualBeliefJESP *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  JointPolicyPureVector *local_48;
  double local_40;
  double local_38;
  
  local_128 = (uint *)0x0;
  local_d0 = lastAI;
  local_c8 = newOI;
  local_48 = jpol;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_140,
             (long)(this->super_Belief)._m_b.super_SDV.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_Belief)._m_b.super_SDV.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type_conflict3 *)&local_128,
             (allocator_type *)&local_88);
  this_00 = &(this->super_Belief)._m_b.super_SDV;
  if (this_00 != &local_140) {
    std::vector<double,_std::allocator<double>_>::operator=(this_00,&local_140);
  }
  local_68 = b_prev;
  if (local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar12 = 0;
  local_118 = (uint *)0x0;
  local_128 = (uint *)0x0;
  iStack_120._M_current = (uint *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_108 = 1;
  while( true ) {
    local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = (Index)uVar12;
    iVar4 = (*(this->_m_pumadp->super_PlanningUnit)._vptr_PlanningUnit[6])();
    if (CONCAT44(extraout_var,iVar4) <= uVar12) break;
    if ((Index)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start != this->_m_agentI) {
      uVar5 = (**(code **)((long)*this->_m_pumadp->_m_madp + 0xc0))();
      pdVar11 = (pointer)(ulong)uVar5;
      local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar11;
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_140);
      }
      else {
        *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)pdVar11;
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar12 = (long)pdVar11 * local_108;
      if (iStack_120._M_current == local_118) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_128,iStack_120,
                   (uint *)&local_f0);
        local_108 = uVar12;
      }
      else {
        *iStack_120._M_current =
             (Index)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
        iStack_120._M_current = iStack_120._M_current + 1;
        local_108 = uVar12;
      }
    }
    uVar12 = (ulong)((Index)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  jointI = 0;
  local_f8 = 0.0;
  this_01 = local_68;
  do {
    uVar5 = (**(code **)(*(long *)&this_01->super_Belief + 0x70))(this_01);
    if (uVar5 <= jointI) {
      uVar12 = 0;
      while( true ) {
        uVar5 = (**(code **)(*(long *)&this->super_Belief + 0x70))(this);
        if (uVar5 <= (uint)uVar12) {
          if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_128 != (uint *)0x0) {
            operator_delete(local_128,(long)local_118 - (long)local_128);
          }
          return local_f8;
        }
        pdVar11 = (this->super_Belief)._m_b.super_SDV.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_Belief)._m_b.super_SDV.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar11 >> 3) <= uVar12) break;
        pdVar11[uVar12] = pdVar11[uVar12] / local_f8;
        uVar12 = uVar12 + 1;
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12)
      ;
    }
    dVar17 = (double)(**(code **)(*(long *)&this_01->super_Belief + 0x48))(this_01);
    if (0.0 < dVar17) {
      local_40 = dVar17;
      IndexTools::JointToIndividualIndicesStepSize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_140,jointI,
                 this_01->_m_stepsizeSJOH,2);
      if (local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      local_cc = *(undefined4 *)
                  local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      operator_delete(local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      GetOthersObservationHistIndex
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_140,this_01,jointI);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_f0,this->_m_nrAgents,(allocator_type *)&local_c0);
      if ((ulong)((long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  CONCAT44(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           (Index)local_f0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) <=
          (ulong)this->_m_agentI) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      *(Index *)(CONCAT44(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          (Index)local_f0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) +
                (ulong)this->_m_agentI * 4) = local_d0;
      if (iStack_120._M_current != local_128) {
        uVar12 = 0;
        uVar13 = 1;
        do {
          uVar8 = (ulong)local_128[uVar12];
          iVar4 = (*(local_48->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                    super_JointPolicy._vptr_JointPolicy[0x13])
                            (local_48,uVar8,
                             (ulong)*(uint *)((long)local_140.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             uVar12 * 4));
          if ((ulong)((long)local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      CONCAT44(local_f0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (Index)local_f0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) <= uVar8) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8);
          }
          *(int *)(CONCAT44(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (Index)local_f0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) + uVar8 * 4) = iVar4;
          bVar2 = uVar13 < (ulong)((long)iStack_120._M_current - (long)local_128 >> 2);
          uVar12 = uVar13;
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (bVar2);
      }
      local_fc = (*(this->_m_pumadp->super_PlanningUnit)._vptr_PlanningUnit[9])
                           (this->_m_pumadp,&local_f0);
      uVar12 = 0;
      while( true ) {
        sVar7 = PlanningUnitMADPDiscrete::GetNrStates(this->_m_pumadp);
        if (sVar7 <= uVar12) break;
        pMVar1 = this->_m_pumadp->_m_madp;
        local_38 = (double)(**(code **)((long)*pMVar1 + 0x108))(pMVar1,local_cc,local_fc,uVar12);
        if ((0.0 < local_38) && (local_108 != 0)) {
          uVar13 = 0;
          do {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_c0,this->_m_nrAgents,(allocator_type *)&local_60);
            if ((ulong)((long)local_c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) <=
                (ulong)this->_m_agentI) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[this->_m_agentI] = local_c8;
            IndexTools::JointToIndividualIndices(&local_60,(Index)uVar13,&local_88);
            if ((long)iStack_120._M_current - (long)local_128 != 0) {
              uVar9 = (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2;
              uVar16 = (long)local_c0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_c0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2;
              uVar8 = 0;
              uVar14 = 1;
              do {
                uVar10 = uVar9;
                uVar15 = uVar8;
                if ((uVar9 <= uVar8) ||
                   (uVar15 = (ulong)local_128[uVar8], uVar10 = uVar16, uVar16 <= uVar15)) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar15,uVar10);
                }
                local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar15] =
                     local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8];
                bVar2 = uVar14 < (ulong)((long)iStack_120._M_current - (long)local_128 >> 2);
                uVar8 = uVar14;
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (bVar2);
            }
            pMVar1 = this->_m_pumadp->_m_madp;
            (**(code **)((long)*pMVar1 + 0xe0))(pMVar1,&local_c0);
            pMVar1 = this->_m_pumadp->_m_madp;
            local_d8 = (double)(**(code **)((long)*pMVar1 + 0x118))(pMVar1,local_fc,uVar12);
            local_a8 = (void *)0x0;
            iStack_a0._M_current = (uint *)0x0;
            local_98 = (uint *)0x0;
            if (iStack_120._M_current != local_128) {
              uVar8 = 0;
              uVar14 = 1;
              do {
                local_c4 = PlanningUnitMADPDiscrete::GetSuccessorOHI
                                     (this->_m_pumadp,local_128[uVar8],
                                      *(Index *)((long)local_140.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                uVar8 * 4),
                                      local_60.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar8]);
                if (iStack_a0._M_current == local_98) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8,
                             iStack_a0,&local_c4);
                }
                else {
                  *iStack_a0._M_current = local_c4;
                  iStack_a0._M_current = iStack_a0._M_current + 1;
                }
                bVar2 = uVar14 < (ulong)((long)iStack_120._M_current - (long)local_128 >> 2);
                uVar8 = uVar14;
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (bVar2);
            }
            IVar6 = GetAugmentedStateIndex
                              (this,(Index)uVar12,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
            uVar8 = (ulong)IVar6;
            pdVar11 = (this->super_Belief)._m_b.super_SDV.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->super_Belief)._m_b.super_SDV.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar11 >> 3) <= uVar8) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            local_d8 = local_d8 * local_38 * local_40;
            pdVar11[uVar8] = local_d8 + pdVar11[uVar8];
            if (local_a8 != (void *)0x0) {
              operator_delete(local_a8,(long)local_98 - (long)local_a8);
            }
            if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_60.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_60.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            local_f8 = local_f8 + local_d8;
            uVar13 = (ulong)((Index)uVar13 + 1);
          } while (uVar13 < local_108);
        }
        uVar12 = (ulong)((Index)uVar12 + 1);
      }
      pvVar3 = (void *)CONCAT44(local_f0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (Index)local_f0.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_f0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      this_01 = local_68;
      if (local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    jointI = jointI + 1;
  } while( true );
}

Assistant:

double IndividualBeliefJESP::Update(
        const IndividualBeliefJESP& b_prev, 
           Index lastAI, Index newOI, const JointPolicyPureVector* jpol)
{
    //set all probs of this belief to 0
    _m_b = vector<double>(_m_b.size(), 0.0);

    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    vector<double> newJB_unnorm;

    size_t nrJO_others = 1;
    Scope otherAgentIndices;
    vector<size_t> nrO_others; 
    for(Index j=0; j < _m_pumadp->GetNrAgents(); j++)
    {
        if(j == _m_agentI)
            continue;
        //else
        Index nrO_j =  _m_pumadp->GetNrObservations(j);
        nrJO_others *= nrO_j;
        nrO_others.push_back(nrO_j);
        otherAgentIndices.push_back(j);
    }

    for(Index prev_eI=0; prev_eI < b_prev.Size(); prev_eI++)
    {
        double probPrev_eI=b_prev.Get(prev_eI);
        if(probPrev_eI>0)// only need to do this if this previous eI is possible
        {
            Index prev_sI = b_prev.GetStateIndex(prev_eI);
            vector<Index> prev_oHist_others = b_prev.
                GetOthersObservationHistIndex(prev_eI);
            vector<Index> actions(_m_nrAgents);
            actions.at(_m_agentI) = lastAI;
            for(Index j=0; j < otherAgentIndices.size(); j++)
            {
                Index ag_j = otherAgentIndices[j];
                Index prev_oHist_j = prev_oHist_others[j];//not ag_j!!!
                Index act_j = jpol->GetActionIndex(ag_j, prev_oHist_j);
                actions.at(ag_j) = act_j;
            }
            Index jaI = _m_pumadp->IndividualToJointActionIndices(actions);
            
            for(Index next_sI=0; next_sI < _m_pumadp->GetNrStates(); next_sI++)
            {
                //note we do not loop over all possible next_eI, because *a lot*
                //of transitions will be 0 ( if next_oHistJ != (prev_oHistJ, oJ) )
                //
                //rather we now loop over all possible oJ (observations of others)
                double Ps_as = _m_pumadp->
                    GetTransitionProbability(prev_sI, jaI, next_sI);
                
                if(Ps_as>0) // only need to do this if this transition can occur
                {
                    for(Index JO_o=0; JO_o < nrJO_others; JO_o++)
                    {
                        vector<Index> oIs(_m_nrAgents);
                        oIs.at(_m_agentI) = newOI; // `our' observation is fixed
                        vector<Index> oIs_others = IndexTools::JointToIndividualIndices(
                            JO_o, nrO_others);
                        for(Index j=0; j < otherAgentIndices.size(); j++)
                            oIs.at( otherAgentIndices.at(j) ) = oIs_others.at(j);
                        
                        Index joI = _m_pumadp->IndividualToJointObservationIndices(oIs);
                        //compute P(joI | jaI,s')
                        double Po_as = _m_pumadp->GetObservationProbability(
                            jaI, next_sI, joI);
                        
                        //prob of next_eI = <next_sI, (oHist_others, oIs_others)>
                        //AND prev_sI can now be computed.
                        //
                        //first, however, lets find the index, next_eI, for 
                        // <next_sI, (oHist_others, oIs_others)>
                    
                        // first find the next_oHist_others indices.
                        vector<Index> next_oHist_others;
                        for(Index j=0; j < otherAgentIndices.size(); j++)
                        {
                            Index next_oHist_j = _m_pumadp->GetSuccessorOHI(otherAgentIndices.at(j), 
                                                                            prev_oHist_others[j],
                                                                            oIs_others[j] );
                            next_oHist_others.push_back(next_oHist_j);
                        }
                        Index next_eI = GetAugmentedStateIndex(next_sI, 
                                                               next_oHist_others);

                        //p += P(oi | ai, <s',oH'>) * P(<s',oH'>|<s,oH>,ai) * b(<s,oH>)
                        //      = P(oi, <s',oH'>|<s,oH'>,ai) * b(<s,oH>)
                        //      = P(s', jo | s, ja) b(<s,oH>)  //ja=<ai, aj>,aj=pol(oHj)
                        //      = P(jo|ja,s')*P(s'|s,ja)
                        double Pso_sa =  Po_as * Ps_as * probPrev_eI;
                        _m_b.at(next_eI) += Pso_sa;
                        Po_ba += Pso_sa; //running sum of P(oi|b,ai)
                    }
                }
            }
        }
    }
    for(Index eI=0; eI < this->Size(); eI++)
        _m_b.at(eI) = _m_b.at(eI) / Po_ba;

    return(Po_ba);

}